

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O0

void BM_Check3(int n)

{
  int iVar1;
  int local_c;
  int n_local;
  
  local_c = n;
  while (iVar1 = local_c + -1, 0 < local_c) {
    if (iVar1 < x) {
      CheckFailure(iVar1,x,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0x8d,"n < x");
    }
    if (iVar1 < x) {
      CheckFailure(iVar1,x,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0x8e,"n < x");
    }
    if (iVar1 < x) {
      CheckFailure(iVar1,x,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0x8f,"n < x");
    }
    if (iVar1 < x) {
      CheckFailure(iVar1,x,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0x90,"n < x");
    }
    if (iVar1 < x) {
      CheckFailure(iVar1,x,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0x91,"n < x");
    }
    if (iVar1 < x) {
      CheckFailure(iVar1,x,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0x92,"n < x");
    }
    if (iVar1 < x) {
      CheckFailure(iVar1,x,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0x93,"n < x");
    }
    local_c = iVar1;
    if (iVar1 < x) {
      CheckFailure(iVar1,x,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0x94,"n < x");
    }
  }
  return;
}

Assistant:

static void BM_Check3(int n) {
  while (n-- > 0) {
    if (n < x) CheckFailure(n, x, __FILE__, __LINE__, "n < x");
    if (n < x) CheckFailure(n, x, __FILE__, __LINE__, "n < x");
    if (n < x) CheckFailure(n, x, __FILE__, __LINE__, "n < x");
    if (n < x) CheckFailure(n, x, __FILE__, __LINE__, "n < x");
    if (n < x) CheckFailure(n, x, __FILE__, __LINE__, "n < x");
    if (n < x) CheckFailure(n, x, __FILE__, __LINE__, "n < x");
    if (n < x) CheckFailure(n, x, __FILE__, __LINE__, "n < x");
    if (n < x) CheckFailure(n, x, __FILE__, __LINE__, "n < x");
  }
}